

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssvectorbase.h
# Opt level: O1

void __thiscall
soplex::
SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::setValue(SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this,int i,
          number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *x)

{
  uint *puVar1;
  int *piVar2;
  pointer pnVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  int32_t iVar7;
  uint uVar8;
  int iVar9;
  long lVar10;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  int local_8c;
  cpp_dec_float<50U,_int,_void> local_88;
  cpp_dec_float<50U,_int,_void> local_50;
  
  local_8c = i;
  if (this->setupStatus == true) {
    uVar8 = IdxSet::pos(&this->super_IdxSet,i);
    if ((int)uVar8 < 0) {
      local_88.data._M_elems._32_8_ = *(undefined8 *)((x->m_backend).data._M_elems + 8);
      local_88.data._M_elems._0_8_ = *(undefined8 *)(x->m_backend).data._M_elems;
      local_88.data._M_elems._8_8_ = *(undefined8 *)((x->m_backend).data._M_elems + 2);
      local_88.data._M_elems._16_8_ = *(undefined8 *)((x->m_backend).data._M_elems + 4);
      local_88.data._M_elems._24_8_ = *(undefined8 *)((x->m_backend).data._M_elems + 6);
      local_88.exp = (x->m_backend).exp;
      local_88.neg = (x->m_backend).neg;
      local_88.fpclass = (x->m_backend).fpclass;
      local_88.prec_elem = (x->m_backend).prec_elem;
      if ((local_88.neg == true) &&
         (local_88.fpclass != cpp_dec_float_finite || local_88.data._M_elems[0] != 0)) {
        local_88.neg = false;
      }
      getEpsilon((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *)&local_50,this);
      if ((local_88.fpclass != cpp_dec_float_NaN) && (local_50.fpclass != cpp_dec_float_NaN)) {
        iVar9 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                          (&local_88,&local_50);
        if (0 < iVar9) {
          IdxSet::add(&this->super_IdxSet,1,&local_8c);
        }
      }
    }
    else {
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<long_long>
                (&local_88,0,(type *)0x0);
      if (((x->m_backend).fpclass != cpp_dec_float_NaN) && (local_88.fpclass != cpp_dec_float_NaN))
      {
        iVar9 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                          (&x->m_backend,&local_88);
        if (iVar9 == 0) {
          piVar2 = (this->super_IdxSet).idx;
          pnVar3 = (this->
                   super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).val.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          iVar9 = piVar2[uVar8];
          pnVar3[iVar9].m_backend.fpclass = cpp_dec_float_finite;
          pnVar3[iVar9].m_backend.prec_elem = 10;
          *(undefined1 (*) [16])&pnVar3[iVar9].m_backend.data = (undefined1  [16])0x0;
          puVar1 = (uint *)((long)&pnVar3[iVar9].m_backend.data + 0x10);
          puVar1[0] = 0;
          puVar1[1] = 0;
          puVar1[2] = 0;
          puVar1[3] = 0;
          *(undefined1 (*) [16])((long)&pnVar3[iVar9].m_backend.data + 0x1d) = (undefined1  [16])0x0
          ;
          iVar9 = (this->super_IdxSet).num;
          (this->super_IdxSet).num = iVar9 + -1;
          piVar2[uVar8] = piVar2[(long)iVar9 + -1];
        }
      }
    }
  }
  lVar10 = (long)local_8c;
  pnVar3 = (this->
           super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).val.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  *(undefined8 *)((long)&pnVar3[lVar10].m_backend.data + 0x20) =
       *(undefined8 *)((x->m_backend).data._M_elems + 8);
  uVar4 = *(undefined8 *)(x->m_backend).data._M_elems;
  uVar5 = *(undefined8 *)((x->m_backend).data._M_elems + 2);
  uVar6 = *(undefined8 *)((x->m_backend).data._M_elems + 6);
  puVar1 = (uint *)((long)&pnVar3[lVar10].m_backend.data + 0x10);
  *(undefined8 *)puVar1 = *(undefined8 *)((x->m_backend).data._M_elems + 4);
  *(undefined8 *)(puVar1 + 2) = uVar6;
  *(undefined8 *)&pnVar3[lVar10].m_backend.data = uVar4;
  *(undefined8 *)((long)&pnVar3[lVar10].m_backend.data + 8) = uVar5;
  pnVar3[lVar10].m_backend.exp = (x->m_backend).exp;
  pnVar3[lVar10].m_backend.neg = (x->m_backend).neg;
  iVar7 = (x->m_backend).prec_elem;
  pnVar3[lVar10].m_backend.fpclass = (x->m_backend).fpclass;
  pnVar3[lVar10].m_backend.prec_elem = iVar7;
  return;
}

Assistant:

void setValue(int i, R x)
   {
      assert(i >= 0);
      assert(i < VectorBase<R>::dim());

      if(isSetup())
      {
         int n = pos(i);

         if(n < 0)
         {
            if(spxAbs(x) > this->getEpsilon())
               IdxSet::add(1, &i);
         }
         else if(x == R(0))
            clearNum(n);
      }

      VectorBase<R>::val[i] = x;

      assert(isConsistent());
   }